

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.cpp
# Opt level: O1

void __thiscall OpenMD::Globals::~Globals(Globals *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppCVar2;
  pointer ppZVar3;
  pointer ppRVar4;
  pointer pcVar5;
  pointer pdVar6;
  Component **elem;
  pointer ppCVar7;
  pointer ppZVar8;
  pointer ppRVar9;
  
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__Globals_002fe170;
  Utils::
  deletePointers<std::map<std::__cxx11::string,OpenMD::MoleculeStamp*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::MoleculeStamp*>>>>
            (&this->moleculeStamps_);
  ppCVar2 = (this->components_).
            super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar7 = (this->components_).
                 super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppCVar7 != ppCVar2; ppCVar7 = ppCVar7 + 1
      ) {
    if (*ppCVar7 != (Component *)0x0) {
      (*((*ppCVar7)->super_DataHolder)._vptr_DataHolder[1])();
    }
  }
  ppZVar3 = (this->zconstraints_).
            super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppZVar8 = (this->zconstraints_).
                 super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppZVar8 != ppZVar3; ppZVar8 = ppZVar8 + 1
      ) {
    if (*ppZVar8 != (ZConsStamp *)0x0) {
      (*((*ppZVar8)->super_DataHolder)._vptr_DataHolder[1])();
    }
  }
  ppRVar4 = (this->restraints_).
            super__Vector_base<OpenMD::RestraintStamp_*,_std::allocator<OpenMD::RestraintStamp_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppRVar9 = (this->restraints_).
                 super__Vector_base<OpenMD::RestraintStamp_*,_std::allocator<OpenMD::RestraintStamp_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppRVar9 != ppRVar4;
      ppRVar9 = ppRVar9 + 1) {
    if (*ppRVar9 != (RestraintStamp *)0x0) {
      (*((*ppRVar9)->super_DataHolder)._vptr_DataHolder[1])();
    }
  }
  if (this->flucQpars_ != (FluctuatingChargeParameters *)0x0) {
    (*(this->flucQpars_->super_DataHolder)._vptr_DataHolder[1])();
  }
  if (this->rnemdPars_ != (RNEMDParameters *)0x0) {
    (*(this->rnemdPars_->super_DataHolder)._vptr_DataHolder[1])();
  }
  if (this->lightPars_ != (LightParameters *)0x0) {
    (*(this->lightPars_->super_DataHolder)._vptr_DataHolder[1])();
  }
  if (this->minimizerPars_ != (MinimizerParameters *)0x0) {
    (*(this->minimizerPars_->super_DataHolder)._vptr_DataHolder[1])();
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FragmentStamp_*>_>_>
  ::~_Rb_tree(&(this->fragmentStamps_)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>_>_>
  ::~_Rb_tree(&(this->moleculeStamps_)._M_t);
  ppRVar9 = (this->restraints_).
            super__Vector_base<OpenMD::RestraintStamp_*,_std::allocator<OpenMD::RestraintStamp_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppRVar9 != (pointer)0x0) {
    operator_delete(ppRVar9,(long)(this->restraints_).
                                  super__Vector_base<OpenMD::RestraintStamp_*,_std::allocator<OpenMD::RestraintStamp_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppRVar9
                   );
  }
  ppZVar8 = (this->zconstraints_).
            super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppZVar8 != (pointer)0x0) {
    operator_delete(ppZVar8,(long)(this->zconstraints_).
                                  super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppZVar8
                   );
  }
  ppCVar7 = (this->components_).
            super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppCVar7 != (pointer)0x0) {
    operator_delete(ppCVar7,(long)(this->components_).
                                  super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar7
                   );
  }
  (this->PrivilegedAxis).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002fc980;
  pcVar5 = (this->PrivilegedAxis).data_._M_dataplus._M_p;
  paVar1 = &(this->PrivilegedAxis).data_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->PrivilegedAxis).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->PrivilegedAxis).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->PrivilegedAxis).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->PotentialSelection).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002fc980;
  pcVar5 = (this->PotentialSelection).data_._M_dataplus._M_p;
  paVar1 = &(this->PotentialSelection).data_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->PotentialSelection).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->PotentialSelection).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->PotentialSelection).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->ConstraintTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->ConstraintTime).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->ConstraintTime).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->ElectricField).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002fe2a0;
  pdVar6 = (this->ElectricField).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar6 != (pointer)0x0) {
    operator_delete(pdVar6,(long)(this->ElectricField).data_.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar6);
  }
  (this->ElectricField).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->ElectricField).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->ElectricField).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->UniformGradientDirection2).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002fe2a0;
  pdVar6 = (this->UniformGradientDirection2).data_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar6 != (pointer)0x0) {
    operator_delete(pdVar6,(long)(this->UniformGradientDirection2).data_.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar6);
  }
  (this->UniformGradientDirection2).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->UniformGradientDirection2).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->UniformGradientDirection2).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->UniformGradientDirection1).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002fe2a0;
  pdVar6 = (this->UniformGradientDirection1).data_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pdVar6 != (pointer)0x0) {
    operator_delete(pdVar6,(long)(this->UniformGradientDirection1).data_.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar6);
  }
  (this->UniformGradientDirection1).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->UniformGradientDirection1).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->UniformGradientDirection1).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->UniformGradientStrength).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->UniformGradientStrength).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->UniformGradientStrength).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->MagneticField).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002fe2a0;
  pdVar6 = (this->MagneticField).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar6 != (pointer)0x0) {
    operator_delete(pdVar6,(long)(this->MagneticField).data_.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar6);
  }
  (this->MagneticField).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->MagneticField).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->MagneticField).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->UniformField).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002fe2a0;
  pdVar6 = (this->UniformField).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar6 != (pointer)0x0) {
    operator_delete(pdVar6,(long)(this->UniformField).data_.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar6);
  }
  (this->UniformField).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->UniformField).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->UniformField).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->MDfileVersion).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->MDfileVersion).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->MDfileVersion).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->Alpha).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_002fc910
  ;
  pcVar5 = (this->Alpha).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->Alpha).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->HULL_Method).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002fc980;
  pcVar5 = (this->HULL_Method).data_._M_dataplus._M_p;
  paVar1 = &(this->HULL_Method).data_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->HULL_Method).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->HULL_Method).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->HULL_Method).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->Restraint_file).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002fc980;
  pcVar5 = (this->Restraint_file).data_._M_dataplus._M_p;
  paVar1 = &(this->Restraint_file).data_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->Restraint_file).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->Restraint_file).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->Restraint_file).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->UseRestraints).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->UseRestraints).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->UseRestraints).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->MTM_R).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_002fc910
  ;
  pcVar5 = (this->MTM_R).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->MTM_R).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->MTM_Sigma).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->MTM_Sigma).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->MTM_Sigma).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->MTM_Io).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->MTM_Io).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->MTM_Io).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->MTM_G).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_002fc910
  ;
  pcVar5 = (this->MTM_G).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->MTM_G).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->MTM_Ce).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->MTM_Ce).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->MTM_Ce).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->UseMultipleTemperatureMethod).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->UseMultipleTemperatureMethod).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->UseMultipleTemperatureMethod).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->NeighborListNeighbors).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->NeighborListNeighbors).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->NeighborListNeighbors).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->AccumulateBoxQuadrupole).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->AccumulateBoxQuadrupole).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->AccumulateBoxQuadrupole).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->AccumulateBoxDipole).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->AccumulateBoxDipole).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->AccumulateBoxDipole).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->LangevinBufferRadius).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->LangevinBufferRadius).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->LangevinBufferRadius).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->FrozenBufferRadius).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->FrozenBufferRadius).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->FrozenBufferRadius).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->SkipPairLoop).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->SkipPairLoop).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->SkipPairLoop).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->UseSphericalBoundaryConditions).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->UseSphericalBoundaryConditions).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->UseSphericalBoundaryConditions).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->BeadSize).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->BeadSize).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->BeadSize).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->Viscosity).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->Viscosity).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->Viscosity).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->HydroPropFile).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002fc980;
  pcVar5 = (this->HydroPropFile).data_._M_dataplus._M_p;
  paVar1 = &(this->HydroPropFile).data_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->HydroPropFile).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->HydroPropFile).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->HydroPropFile).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->StatFilePrecision).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->StatFilePrecision).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->StatFilePrecision).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->StatFileFormat).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002fc980;
  pcVar5 = (this->StatFileFormat).data_._M_dataplus._M_p;
  paVar1 = &(this->StatFileFormat).data_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->StatFileFormat).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->StatFileFormat).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->StatFileFormat).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->SkinThickness).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->SkinThickness).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->SkinThickness).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->OutputDensity).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->OutputDensity).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->OutputDensity).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->OutputSitePotential).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->OutputSitePotential).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->OutputSitePotential).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->OutputFluctuatingCharges).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->OutputFluctuatingCharges).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->OutputFluctuatingCharges).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->OutputElectricField).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->OutputElectricField).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->OutputElectricField).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->OutputParticlePotential).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->OutputParticlePotential).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->OutputParticlePotential).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->OutputForceVector).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->OutputForceVector).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->OutputForceVector).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->CompressDumpFile).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->CompressDumpFile).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->CompressDumpFile).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->SwitchingFunctionType).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002fc980;
  pcVar5 = (this->SwitchingFunctionType).data_._M_dataplus._M_p;
  paVar1 = &(this->SwitchingFunctionType).data_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->SwitchingFunctionType).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->SwitchingFunctionType).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->SwitchingFunctionType).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->CutoffMethod).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002fc980;
  pcVar5 = (this->CutoffMethod).data_._M_dataplus._M_p;
  paVar1 = &(this->CutoffMethod).data_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->CutoffMethod).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->CutoffMethod).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->CutoffMethod).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->Dielectric).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->Dielectric).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->Dielectric).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->DampingAlpha).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->DampingAlpha).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->DampingAlpha).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->UseSlabGeometry).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->UseSlabGeometry).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->UseSlabGeometry).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->UseSurfaceTerm).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->UseSurfaceTerm).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->UseSurfaceTerm).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->ElectrostaticScreeningMethod).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002fc980;
  pcVar5 = (this->ElectrostaticScreeningMethod).data_._M_dataplus._M_p;
  paVar1 = &(this->ElectrostaticScreeningMethod).data_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->ElectrostaticScreeningMethod).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->ElectrostaticScreeningMethod).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->ElectrostaticScreeningMethod).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->ElectrostaticSummationMethod).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002fc980;
  pcVar5 = (this->ElectrostaticSummationMethod).data_._M_dataplus._M_p;
  paVar1 = &(this->ElectrostaticSummationMethod).data_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->ElectrostaticSummationMethod).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->ElectrostaticSummationMethod).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->ElectrostaticSummationMethod).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->PrintTaggedPairDistance).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->PrintTaggedPairDistance).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->PrintTaggedPairDistance).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->TaggedAtomPair).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->TaggedAtomPair).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->TaggedAtomPair).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->PrintHeatFlux).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->PrintHeatFlux).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->PrintHeatFlux).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->PrintVirialTensor).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->PrintVirialTensor).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->PrintVirialTensor).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->PrintPressureTensor).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->PrintPressureTensor).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->PrintPressureTensor).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->SurfaceTension).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->SurfaceTension).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->SurfaceTension).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->ForceFieldFileName).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002fc980;
  pcVar5 = (this->ForceFieldFileName).data_._M_dataplus._M_p;
  paVar1 = &(this->ForceFieldFileName).data_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->ForceFieldFileName).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->ForceFieldFileName).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->ForceFieldFileName).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->ForceFieldVariant).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002fc980;
  pcVar5 = (this->ForceFieldVariant).data_._M_dataplus._M_p;
  paVar1 = &(this->ForceFieldVariant).data_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->ForceFieldVariant).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->ForceFieldVariant).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->ForceFieldVariant).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->ThermodynamicIntegrationK).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->ThermodynamicIntegrationK).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->ThermodynamicIntegrationK).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->ThermodynamicIntegrationLambda).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->ThermodynamicIntegrationLambda).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->ThermodynamicIntegrationLambda).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->UseThermodynamicIntegration).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->UseThermodynamicIntegration).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->UseThermodynamicIntegration).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->ZconsUsingSMD).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->ZconsUsingSMD).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->ZconsUsingSMD).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->ZconsFixtime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->ZconsFixtime).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->ZconsFixtime).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->ZconsGap).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->ZconsGap).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->ZconsGap).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->OrthoBoxTolerance).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->OrthoBoxTolerance).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->OrthoBoxTolerance).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->UseIntialExtendedSystemState).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->UseIntialExtendedSystemState).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->UseIntialExtendedSystemState).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->UseInitalTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->UseInitalTime).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->UseInitalTime).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->Seed).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->Seed).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->Seed).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->ZconsForcePolicy).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002fc980;
  pcVar5 = (this->ZconsForcePolicy).data_._M_dataplus._M_p;
  paVar1 = &(this->ZconsForcePolicy).data_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->ZconsForcePolicy).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->ZconsForcePolicy).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->ZconsForcePolicy).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->ZconsTol).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->ZconsTol).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->ZconsTol).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->ZconsTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->ZconsTime).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->ZconsTime).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->LangevinPistonDrag).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->LangevinPistonDrag).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->LangevinPistonDrag).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->TauBarostat).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->TauBarostat).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->TauBarostat).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->TauThermostat).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->TauThermostat).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->TauThermostat).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->UseLongRangeCorrections).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->UseLongRangeCorrections).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->UseLongRangeCorrections).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->UseAtomicVirial).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->UseAtomicVirial).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->UseAtomicVirial).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->TargetPressure).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->TargetPressure).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->TargetPressure).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->ConserveAngularMomentum).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->ConserveAngularMomentum).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->ConserveAngularMomentum).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->ConserveLinearMomentum).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->ConserveLinearMomentum).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->ConserveLinearMomentum).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->UsePeriodicBoundaryConditions).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->UsePeriodicBoundaryConditions).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->UsePeriodicBoundaryConditions).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->ThermalTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->ThermalTime).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->ThermalTime).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->TempSet).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->TempSet).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->TempSet).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->SwitchingRadius).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->SwitchingRadius).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->SwitchingRadius).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->CutoffRadius).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->CutoffRadius).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->CutoffRadius).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->StatusTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->StatusTime).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->StatusTime).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->ResetTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->ResetTime).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->ResetTime).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->SampleTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->SampleTime).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->SampleTime).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->FinalConfig).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002fc980;
  pcVar5 = (this->FinalConfig).data_._M_dataplus._M_p;
  paVar1 = &(this->FinalConfig).data_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->FinalConfig).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->FinalConfig).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->FinalConfig).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->RunTime).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->RunTime).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->RunTime).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->Dt).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->Dt).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->Dt).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->Ensemble).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__Parameter_002fc980;
  pcVar5 = (this->Ensemble).data_._M_dataplus._M_p;
  paVar1 = &(this->Ensemble).data_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->Ensemble).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->Ensemble).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->Ensemble).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->TargetTemp).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->TargetTemp).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->TargetTemp).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->ForceField).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002fc980;
  pcVar5 = (this->ForceField).data_._M_dataplus._M_p;
  paVar1 = &(this->ForceField).data_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->ForceField).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fc910;
  pcVar5 = (this->ForceField).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->ForceField).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__DataHolder_002fbdf8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->super_DataHolder).deprecatedKeywords_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
  ::~_Rb_tree(&(this->super_DataHolder).parameters_._M_t);
  return;
}

Assistant:

Globals::~Globals() {
    Utils::deletePointers(moleculeStamps_);

    Utils::deletePointers(components_);
    Utils::deletePointers(zconstraints_);
    Utils::deletePointers(restraints_);

    delete flucQpars_;
    delete rnemdPars_;
    delete lightPars_;
    delete minimizerPars_;
  }